

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_dec_model_op_parameters
               (aom_dec_model_op_parameters_t *op_params,int buffer_delay_length,
               aom_write_bit_buffer *wb)

{
  aom_write_bit_buffer *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  aom_wb_write_unsigned_literal
            ((aom_write_bit_buffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (uint32_t)((ulong)in_RDX >> 0x20),(int)in_RDX);
  aom_wb_write_unsigned_literal
            ((aom_write_bit_buffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (uint32_t)((ulong)in_RDX >> 0x20),(int)in_RDX);
  aom_wb_write_bit(in_RDX,*(int *)(in_RDI + 0x20));
  return;
}

Assistant:

static inline void write_dec_model_op_parameters(
    const aom_dec_model_op_parameters_t *op_params, int buffer_delay_length,
    struct aom_write_bit_buffer *wb) {
  aom_wb_write_unsigned_literal(wb, op_params->decoder_buffer_delay,
                                buffer_delay_length);
  aom_wb_write_unsigned_literal(wb, op_params->encoder_buffer_delay,
                                buffer_delay_length);
  aom_wb_write_bit(wb, op_params->low_delay_mode_flag);
}